

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O0

void __thiscall t_rb_generator::generate_const(t_rb_generator *this,t_const *tconst)

{
  int iVar1;
  t_const_value *value_00;
  char *pcVar2;
  undefined1 *puVar3;
  t_rb_ofstream *ptVar4;
  ostream *poVar5;
  t_const_value *value;
  string name;
  t_type *type;
  t_const *tconst_local;
  t_rb_generator *this_local;
  
  name.field_2._8_8_ = t_const::get_type(tconst);
  t_const::get_name_abi_cxx11_((string *)&value,tconst);
  value_00 = t_const::get_value(tconst);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&value);
  iVar1 = toupper((int)*pcVar2);
  puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&value);
  *puVar3 = (char)iVar1;
  ptVar4 = t_rb_ofstream::indent(&this->f_consts_);
  poVar5 = std::operator<<((ostream *)ptVar4,(string *)&value);
  std::operator<<(poVar5," = ");
  ptVar4 = render_const_value(this,&this->f_consts_,(t_type *)name.field_2._8_8_,value_00);
  poVar5 = std::operator<<((ostream *)ptVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void t_rb_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  name[0] = toupper(name[0]);

  f_consts_.indent() << name << " = ";
  render_const_value(f_consts_, type, value) << endl << endl;
}